

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O3

astcenc_error astcenc_decompress_reset(astcenc_context *ctxo)

{
  undefined8 uVar1;
  
  (ctxo->manage_decompress).m_init_done = false;
  (ctxo->manage_decompress).m_term_done = false;
  LOCK();
  (ctxo->manage_decompress).m_is_cancelled._M_base._M_i = false;
  UNLOCK();
  LOCK();
  (ctxo->manage_decompress).m_start_count.super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  (ctxo->manage_decompress).m_done_count = 0;
  (ctxo->manage_decompress).m_task_count = 0;
  (ctxo->manage_decompress).m_callback = (astcenc_progress_callback)0x0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  (ctxo->manage_decompress).m_callback_min_diff = (float)(int)uVar1;
  (ctxo->manage_decompress).m_callback_last_value = (float)(int)((ulong)uVar1 >> 0x20);
  return ASTCENC_SUCCESS;
}

Assistant:

void reset()
	{
		m_init_done = false;
		m_term_done = false;
		m_is_cancelled = false;
		m_start_count = 0;
		m_done_count = 0;
		m_task_count = 0;
		m_callback = nullptr;
		m_callback_last_value = 0.0f;
		m_callback_min_diff = 1.0f;
	}